

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O0

void __thiscall DNSResolve::RemoveCallback(DNSResolve *this,IDNSNotify *callback)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  pointer ppVar4;
  size_type sVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
  pVar6;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
  local_48;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
  range_callbacks;
  string hostname;
  IDNSNotify *callback_local;
  DNSResolve *this_local;
  
  hostname.field_2._8_8_ = callback;
  sVar2 = std::
          map<IDNSNotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&this->cb_to_hostname_,(key_type *)((long)&hostname.field_2 + 8));
  if (sVar2 != 0) {
    pmVar3 = std::
             map<IDNSNotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->cb_to_hostname_,(key_type *)((long)&hostname.field_2 + 8));
    std::__cxx11::string::string((string *)&range_callbacks.second,(string *)pmVar3);
    pVar6 = std::
            multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
            ::equal_range(&this->hostname_to_cb_,(key_type *)&range_callbacks.second);
    while( true ) {
      range_callbacks.first = pVar6.second._M_node;
      local_48 = pVar6.first._M_node;
      bVar1 = std::operator!=(&local_48,&range_callbacks.first);
      if (!bVar1) break;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
               ::operator->(&local_48);
      if (ppVar4->second == (IDNSNotify *)hostname.field_2._8_8_) {
        std::
        multimap<std::__cxx11::string,IDNSNotify*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IDNSNotify*>>>
        ::erase_abi_cxx11_((multimap<std::__cxx11::string,IDNSNotify*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IDNSNotify*>>>
                            *)&this->hostname_to_cb_,(iterator)local_48._M_node);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
      ::operator++(&local_48);
      pVar6.second._M_node = range_callbacks.first._M_node;
      pVar6.first._M_node = local_48._M_node;
    }
    sVar5 = std::
            multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
            ::count(&this->hostname_to_cb_,(key_type *)&range_callbacks.second);
    if (sVar5 == 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::erase(&this->hostname_status_,(key_type *)&range_callbacks.second);
    }
    std::
    map<IDNSNotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase(&this->cb_to_hostname_,(key_type *)((long)&hostname.field_2 + 8));
    std::__cxx11::string::~string((string *)&range_callbacks.second);
  }
  return;
}

Assistant:

void DNSResolve::RemoveCallback(IDNSNotify* callback)
{
    if (cb_to_hostname_.count(callback) == 0)
    {
        return;
    }
    string hostname = cb_to_hostname_[callback];

    auto range_callbacks = hostname_to_cb_.equal_range(hostname);
    while (range_callbacks.first != range_callbacks.second)
    {
        if (range_callbacks.first->second == callback)
        {
            hostname_to_cb_.erase(range_callbacks.first);
        }
        ++range_callbacks.first;
    }
    if (hostname_to_cb_.count(hostname) == 0)
    {
        hostname_status_.erase(hostname);
    }
    cb_to_hostname_.erase(callback);
}